

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O3

Status __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_solveRealStable(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,bool acceptUnbounded,bool acceptInfeasible,
                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *primal,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *dual,
                  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                  *basisStatusRows,
                  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                  *basisStatusCols,bool forceNoSimplifier)

{
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  bool bVar1;
  int value;
  int value_00;
  int iVar2;
  int value_01;
  int value_02;
  Verbosity VVar3;
  ostream *poVar4;
  bool bVar5;
  char cVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  Status SVar11;
  int iVar12;
  Settings *pSVar13;
  undefined8 uVar14;
  SPxOut *pSVar15;
  undefined7 in_register_00000011;
  Verbosity old_verbosity_1;
  undefined7 in_register_00000031;
  bool bVar16;
  Verbosity old_verbosity_4;
  bool bVar17;
  bool bVar18;
  bool fromscratch;
  Verbosity old_verbosity;
  bool bVar19;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<50U,_int,_void> local_348;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_310;
  int local_304;
  undefined4 local_300;
  undefined4 local_2fc;
  SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2f8;
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2e8;
  SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2e0;
  ulong local_2d8;
  SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2d0;
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2c8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2c0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2b8;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined5 uStack_290;
  undefined3 uStack_28b;
  undefined5 local_288;
  undefined3 uStack_283;
  int local_280;
  bool local_27c;
  undefined8 local_278;
  cpp_dec_float<50U,_int,_void> local_268;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined5 uStack_210;
  undefined3 uStack_20b;
  undefined5 local_208;
  undefined3 uStack_203;
  int local_200;
  bool local_1fc;
  undefined8 local_1f8;
  cpp_dec_float<50U,_int,_void> local_1e8;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined5 uStack_190;
  undefined3 uStack_18b;
  undefined5 local_188;
  undefined3 uStack_183;
  int local_180;
  bool local_17c;
  undefined8 local_178;
  cpp_dec_float<50U,_int,_void> local_168;
  uint local_128 [2];
  uint auStack_120 [2];
  uint local_118 [2];
  uint auStack_110 [2];
  uint local_108 [6];
  undefined8 uStack_f0;
  cpp_dec_float<50U,_int,_void> local_e0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined5 uStack_90;
  undefined3 uStack_8b;
  undefined5 uStack_88;
  undefined8 uStack_83;
  undefined8 local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_300 = (undefined4)CONCAT71(in_register_00000011,acceptInfeasible);
  local_2fc = (undefined4)CONCAT71(in_register_00000031,acceptUnbounded);
  local_108._0_8_ = *(undefined8 *)((this->_slufactor).lastThreshold.m_backend.data._M_elems + 8);
  local_128 = *(uint (*) [2])(this->_slufactor).lastThreshold.m_backend.data._M_elems;
  auStack_120 = *(uint (*) [2])((this->_slufactor).lastThreshold.m_backend.data._M_elems + 2);
  local_118 = *(uint (*) [2])((this->_slufactor).lastThreshold.m_backend.data._M_elems + 4);
  auStack_110 = *(uint (*) [2])((this->_slufactor).lastThreshold.m_backend.data._M_elems + 6);
  local_304 = (this->_slufactor).lastThreshold.m_backend.exp;
  bVar1 = (this->_slufactor).lastThreshold.m_backend.neg;
  local_108[4] = (this->_slufactor).lastThreshold.m_backend.fpclass;
  local_108[5] = (this->_slufactor).lastThreshold.m_backend.prec_elem;
  uStack_f0 = 0;
  pSVar13 = this->_currentSettings;
  value = pSVar13->_intParamValues[0xe];
  value_00 = pSVar13->_intParamValues[0xd];
  iVar2 = pSVar13->_intParamValues[2];
  value_01 = pSVar13->_intParamValues[10];
  value_02 = pSVar13->_intParamValues[0xb];
  if (((forceNoSimplifier) && (DAT_006abda8 < 1)) && (-1 < DAT_006abe18)) {
    this->_boostedSimplifier =
         (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0;
    this->_simplifier =
         (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0;
    pSVar13->_intParamValues[10] = 0;
  }
  local_2e0 = &this->_slufactor;
  this_00 = &this->_solver;
  local_310 = &(this->_solver).entertolscale;
  local_2e8 = &(this->_solver).leavetolscale;
  local_2f0 = &(this->_ratiotesterTextbook).
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  local_2c8 = &(this->_ratiotesterFast).
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  local_2f8 = &(this->_pricerDevex).
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  local_2d0 = (SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)&this->_pricerSteep;
  bVar18 = true;
  bVar5 = false;
  bVar7 = false;
  bVar8 = false;
  bVar9 = false;
  bVar10 = false;
  local_2d8 = 0;
  bVar19 = false;
  bVar16 = false;
  bVar17 = false;
  fromscratch = false;
  local_2c0 = primal;
  local_2b8 = dual;
  local_2b0 = basisStatusRows;
LAB_00355353:
  while( true ) {
    while( true ) {
      SVar11 = _solveRealForRational(this,fromscratch,local_2c0,local_2b8,local_2b0,basisStatusCols)
      ;
      if (SVar11 == INFEASIBLE) {
        if ((char)local_300 != '\0') goto LAB_00356389;
      }
      else if (SVar11 == OPTIMAL) goto LAB_00356389;
      if ((((byte)local_2fc & SVar11 == UNBOUNDED) != 0) ||
         ((uint)(SVar11 + (INForUNBD|INFEASIBLE)) < 2)) goto LAB_00356389;
      if ((bVar18) && (VVar3 = (this->spxout).m_verbosity, 2 < (int)VVar3)) {
        (this->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[3],"Numerical troubles during floating-point solve.",
                   0x2f);
        poVar4 = (this->spxout).m_streams[(this->spxout).m_verbosity];
        cVar6 = (char)poVar4;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar6);
        std::ostream::put(cVar6);
        std::ostream::flush();
        (this->spxout).m_verbosity = VVar3;
      }
      if (((local_2d8 & 1) == 0) &&
         ((pSVar13 = this->_currentSettings, pSVar13->_intParamValues[10] != 0 ||
          (pSVar13->_intParamValues[0xb] != 0)))) goto LAB_00355664;
      setIntParam(this,SCALER,value_02,true);
      setIntParam(this,SIMPLIFIER,value_01,true);
      if (bVar16) break;
      VVar3 = (this->spxout).m_verbosity;
      if (2 < (int)VVar3) {
        (this->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[3],"Increasing Markowitz threshold.",0x1f);
        poVar4 = (this->spxout).m_streams[(this->spxout).m_verbosity];
        cVar6 = (char)poVar4;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar6);
        std::ostream::put(cVar6);
        std::ostream::flush();
        (this->spxout).m_verbosity = VVar3;
      }
      local_78 = 0xa00000000;
      local_a8 = 0;
      uStack_a0 = 0;
      local_98 = 0;
      uStack_90 = 0;
      uStack_8b = 0;
      uStack_88 = 0;
      uStack_83 = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_a8,0.9);
      SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setMarkowitz(local_2e0,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_a8);
      bVar16 = true;
      bVar18 = false;
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::factorize(this_00);
    }
    if (bVar17) break;
    VVar3 = (this->spxout).m_verbosity;
    bVar16 = true;
    bVar18 = false;
    bVar17 = true;
    fromscratch = true;
    if (2 < (int)VVar3) {
      (this->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[3],"Solving from scratch.",0x15);
      poVar4 = (this->spxout).m_streams[(this->spxout).m_verbosity];
      cVar6 = (char)poVar4;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
      (this->spxout).m_verbosity = VVar3;
      goto LAB_00355b0a;
    }
  }
  setIntParam(this,RATIOTESTER,value,true);
  setIntParam(this,PRICER,value_00,true);
  if (bVar7) {
    if (bVar8 || forceNoSimplifier) {
      if ((DAT_006abda8 < 1) && (-1 < DAT_006abe18)) {
        this->_boostedSimplifier =
             (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)0x0;
        this->_simplifier =
             (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)0x0;
        this->_currentSettings->_intParamValues[10] = 0;
      }
      if (bVar19) {
        if (SVar11 == INFEASIBLE || bVar5) {
          if ((DAT_006abd88 <= iVar2) && (iVar2 <= DAT_006abdf8)) {
            this->_currentSettings->_intParamValues[2] = iVar2;
          }
          VVar3 = (this->spxout).m_verbosity;
          if (bVar9) {
            if (bVar10) {
              if (2 < (int)VVar3) {
                (this->spxout).m_verbosity = INFO1;
                pSVar15 = soplex::operator<<(&this->spxout,"Giving up.");
                std::endl<char,std::char_traits<char>>(pSVar15->m_streams[pSVar15->m_verbosity]);
                (this->spxout).m_verbosity = VVar3;
              }
LAB_00356389:
              local_68.m_backend.data._M_elems[8] = local_108[0];
              local_68.m_backend.data._M_elems[9] = local_108[1];
              local_68.m_backend.data._M_elems[4] = local_118[0];
              local_68.m_backend.data._M_elems[5] = local_118[1];
              local_68.m_backend.data._M_elems[6] = auStack_110[0];
              local_68.m_backend.data._M_elems[7] = auStack_110[1];
              local_68.m_backend.data._M_elems[0] = local_128[0];
              local_68.m_backend.data._M_elems[1] = local_128[1];
              local_68.m_backend.data._M_elems[2] = auStack_120[0];
              local_68.m_backend.data._M_elems[3] = auStack_120[1];
              local_68.m_backend.exp = local_304;
              local_68.m_backend.fpclass = local_108[4];
              local_68.m_backend.prec_elem = local_108[5];
              local_68.m_backend.neg = bVar1;
              SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::setMarkowitz(local_2e0,&local_68);
              setIntParam(this,RATIOTESTER,value,true);
              setIntParam(this,PRICER,value_00,true);
              setIntParam(this,SIMPLIFIER,value_01,true);
              setIntParam(this,SCALER,value_02,true);
              if ((DAT_006abd88 <= iVar2) && (iVar2 <= DAT_006abdf8)) {
                this->_currentSettings->_intParamValues[2] = iVar2;
              }
              return SVar11;
            }
            if (2 < (int)VVar3) {
              (this->spxout).m_verbosity = INFO1;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((this->spxout).m_streams[3],"Switching pricer.",0x11);
              poVar4 = (this->spxout).m_streams[(this->spxout).m_verbosity];
              cVar6 = (char)poVar4;
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar6);
              std::ostream::put(cVar6);
              std::ostream::flush();
              (this->spxout).m_verbosity = VVar3;
            }
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::setType(this_00,(uint)((this->_solver).theType != LEAVE) * 2 + ENTER);
            if ((this->_solver).thepricer == local_2f8) {
              bVar18 = false;
              bVar7 = true;
              bVar9 = true;
              bVar10 = true;
              bVar19 = true;
              bVar16 = true;
              bVar17 = false;
              if (DAT_006abe24 < 5 || 5 < DAT_006abdb4) goto LAB_00355353;
              SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::setPricer(this_00,local_2d0,false);
              this->_currentSettings->_intParamValues[0xd] = 5;
            }
            else {
              bVar18 = false;
              bVar7 = true;
              bVar9 = true;
              bVar10 = true;
              bVar19 = true;
              bVar16 = true;
              bVar17 = false;
              if (DAT_006abe24 < 3 || 3 < DAT_006abdb4) goto LAB_00355353;
              SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::setPricer(this_00,local_2f8,false);
              this->_currentSettings->_intParamValues[0xd] = 3;
            }
            bVar9 = true;
            bVar10 = true;
          }
          else {
            if (2 < (int)VVar3) {
              (this->spxout).m_verbosity = INFO1;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((this->spxout).m_streams[3],"Switching ratio test.",0x15);
              poVar4 = (this->spxout).m_streams[(this->spxout).m_verbosity];
              cVar6 = (char)poVar4;
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar6);
              std::ostream::put(cVar6);
              std::ostream::flush();
              (this->spxout).m_verbosity = VVar3;
            }
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::setType(this_00,(uint)((this->_solver).theType != LEAVE) * 2 + ENTER);
            if ((this->_solver).theratiotester == local_2f0) {
              bVar18 = false;
              bVar7 = true;
              bVar9 = true;
              bVar19 = true;
              bVar16 = true;
              bVar17 = false;
              if (DAT_006abe28 < 2 || 2 < DAT_006abdb8) goto LAB_00355353;
              SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::setTester(this_00,local_2c8,false);
              this->_currentSettings->_intParamValues[0xe] = 2;
            }
            else {
              bVar18 = false;
              bVar7 = true;
              bVar9 = true;
              bVar19 = true;
              bVar16 = true;
              bVar17 = false;
              if (DAT_006abe28 < 0 || 0 < DAT_006abdb8) goto LAB_00355353;
              SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::setTester(this_00,local_2f0,false);
              this->_currentSettings->_intParamValues[0xe] = 0;
            }
            bVar9 = true;
          }
        }
        else {
          VVar3 = (this->spxout).m_verbosity;
          if (2 < (int)VVar3) {
            (this->spxout).m_verbosity = INFO1;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((this->spxout).m_streams[3],"Tightening tolerances.",0x16);
            poVar4 = (this->spxout).m_streams[(this->spxout).m_verbosity];
            cVar6 = (char)poVar4;
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar6);
            std::ostream::put(cVar6);
            std::ostream::flush();
            (this->spxout).m_verbosity = VVar3;
          }
          if ((DAT_006abd88 < 2) && (0 < DAT_006abdf8)) {
            this->_currentSettings->_intParamValues[2] = 1;
          }
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::entertol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_e0,this_00);
          if (local_e0.fpclass == cpp_dec_float_NaN) {
LAB_003560a9:
            local_278._0_4_ = cpp_dec_float_finite;
            local_278._4_4_ = 10;
            local_2a8 = 0;
            uStack_2a0 = 0;
            local_298 = 0;
            uStack_290 = 0;
            uStack_28b = 0;
            local_288 = 0;
            uStack_283 = 0;
            local_280 = 0;
            local_27c = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_2a8,0.001);
            *(undefined8 *)(local_310->m_backend).data._M_elems = local_2a8;
            *(undefined8 *)((local_310->m_backend).data._M_elems + 2) = uStack_2a0;
            *(undefined8 *)((local_310->m_backend).data._M_elems + 4) = local_298;
            *(ulong *)((local_310->m_backend).data._M_elems + 6) = CONCAT35(uStack_28b,uStack_290);
            *(ulong *)((local_310->m_backend).data._M_elems + 8) = CONCAT35(uStack_283,local_288);
            (this->_solver).entertolscale.m_backend.exp = local_280;
            (this->_solver).entertolscale.m_backend.neg = local_27c;
            uVar14 = local_278;
          }
          else {
            local_348.fpclass = cpp_dec_float_finite;
            local_348.prec_elem = 10;
            local_348.data._M_elems[0] = 0;
            local_348.data._M_elems[1] = 0;
            local_348.data._M_elems[2] = 0;
            local_348.data._M_elems[3] = 0;
            local_348.data._M_elems[4] = 0;
            local_348.data._M_elems[5] = 0;
            local_348.data._M_elems._24_5_ = 0;
            local_348.data._M_elems[7]._1_3_ = 0;
            local_348.data._M_elems._32_5_ = 0;
            local_348._37_8_ = 0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_348,1e-06);
            iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_e0,&local_348);
            if (-1 < iVar12) goto LAB_003560a9;
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::entertol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_e0,this_00);
            local_268.fpclass = cpp_dec_float_finite;
            local_268.prec_elem = 10;
            local_268.data._M_elems[0] = 0;
            local_268.data._M_elems[1] = 0;
            local_268.data._M_elems[2] = 0;
            local_268.data._M_elems[3] = 0;
            local_268.data._M_elems[4] = 0;
            local_268.data._M_elems[5] = 0;
            local_268.data._M_elems._24_5_ = 0;
            local_268.data._M_elems[7]._1_3_ = 0;
            local_268.data._M_elems._32_5_ = 0;
            local_268.data._M_elems[9]._1_3_ = 0;
            local_268.exp = 0;
            local_268.neg = false;
            local_348.fpclass = cpp_dec_float_finite;
            local_348.prec_elem = 10;
            local_348.data._M_elems[0] = 0;
            local_348.data._M_elems[1] = 0;
            local_348.data._M_elems[2] = 0;
            local_348.data._M_elems[3] = 0;
            local_348.data._M_elems[4] = 0;
            local_348.data._M_elems[5] = 0;
            local_348.data._M_elems._24_5_ = 0;
            local_348.data._M_elems[7]._1_3_ = 0;
            local_348.data._M_elems._32_5_ = 0;
            local_348._37_8_ = 0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_348,1e-09);
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_268,&local_348,&local_e0);
            *(ulong *)((local_310->m_backend).data._M_elems + 8) =
                 CONCAT35(local_268.data._M_elems[9]._1_3_,local_268.data._M_elems._32_5_);
            *(undefined8 *)((local_310->m_backend).data._M_elems + 4) =
                 local_268.data._M_elems._16_8_;
            *(ulong *)((local_310->m_backend).data._M_elems + 6) =
                 CONCAT35(local_268.data._M_elems[7]._1_3_,local_268.data._M_elems._24_5_);
            *(undefined8 *)(local_310->m_backend).data._M_elems = local_268.data._M_elems._0_8_;
            *(undefined8 *)((local_310->m_backend).data._M_elems + 2) =
                 local_268.data._M_elems._8_8_;
            (this->_solver).entertolscale.m_backend.exp = local_268.exp;
            (this->_solver).entertolscale.m_backend.neg = local_268.neg;
            uVar14 = local_268._48_8_;
          }
          (this->_solver).entertolscale.m_backend.fpclass = (fpclass_type)uVar14;
          (this->_solver).entertolscale.m_backend.prec_elem = SUB84(uVar14,4);
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::entertol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_e0,this_00);
          if (local_e0.fpclass == cpp_dec_float_NaN) {
            bVar5 = false;
          }
          else {
            local_348.fpclass = cpp_dec_float_finite;
            local_348.prec_elem = 10;
            local_348.data._M_elems[0] = 0;
            local_348.data._M_elems[1] = 0;
            local_348.data._M_elems[2] = 0;
            local_348.data._M_elems[3] = 0;
            local_348.data._M_elems[4] = 0;
            local_348.data._M_elems[5] = 0;
            local_348.data._M_elems._24_5_ = 0;
            local_348.data._M_elems[7]._1_3_ = 0;
            local_348.data._M_elems._32_5_ = 0;
            local_348._37_8_ = 0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_348,1e-09);
            iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_e0,&local_348);
            bVar5 = iVar12 < 1;
          }
        }
        bVar19 = true;
      }
      else {
        VVar3 = (this->spxout).m_verbosity;
        if (2 < (int)VVar3) {
          (this->spxout).m_verbosity = INFO1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((this->spxout).m_streams[3],"Relaxing tolerances.",0x14);
          poVar4 = (this->spxout).m_streams[(this->spxout).m_verbosity];
          cVar6 = (char)poVar4;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar6);
          std::ostream::put(cVar6);
          std::ostream::flush();
          (this->spxout).m_verbosity = VVar3;
        }
        if ((DAT_006abd88 < 1) && (-1 < DAT_006abdf8)) {
          this->_currentSettings->_intParamValues[2] = 0;
        }
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::entertol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_e0,this_00);
        if (local_e0.fpclass == cpp_dec_float_NaN) {
LAB_00355cc2:
          local_178._0_4_ = cpp_dec_float_finite;
          local_178._4_4_ = 10;
          local_1a8 = 0;
          uStack_1a0 = 0;
          local_198 = 0;
          uStack_190 = 0;
          uStack_18b = 0;
          local_188 = 0;
          uStack_183 = 0;
          local_180 = 0;
          local_17c = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_1a8,1000.0);
          *(undefined8 *)(local_310->m_backend).data._M_elems = local_1a8;
          *(undefined8 *)((local_310->m_backend).data._M_elems + 2) = uStack_1a0;
          *(undefined8 *)((local_310->m_backend).data._M_elems + 4) = local_198;
          *(ulong *)((local_310->m_backend).data._M_elems + 6) = CONCAT35(uStack_18b,uStack_190);
          *(ulong *)((local_310->m_backend).data._M_elems + 8) = CONCAT35(uStack_183,local_188);
          (this->_solver).entertolscale.m_backend.exp = local_180;
          (this->_solver).entertolscale.m_backend.neg = local_17c;
          uVar14 = local_178;
        }
        else {
          local_348.fpclass = cpp_dec_float_finite;
          local_348.prec_elem = 10;
          local_348.data._M_elems[0] = 0;
          local_348.data._M_elems[1] = 0;
          local_348.data._M_elems[2] = 0;
          local_348.data._M_elems[3] = 0;
          local_348.data._M_elems[4] = 0;
          local_348.data._M_elems[5] = 0;
          local_348.data._M_elems._24_5_ = 0;
          local_348.data._M_elems[7]._1_3_ = 0;
          local_348.data._M_elems._32_5_ = 0;
          local_348._37_8_ = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_348,1e-06);
          iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_e0,&local_348);
          if (iVar12 < 1) goto LAB_00355cc2;
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::entertol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_e0,this_00);
          local_168.fpclass = cpp_dec_float_finite;
          local_168.prec_elem = 10;
          local_168.data._M_elems[0] = 0;
          local_168.data._M_elems[1] = 0;
          local_168.data._M_elems[2] = 0;
          local_168.data._M_elems[3] = 0;
          local_168.data._M_elems[4] = 0;
          local_168.data._M_elems[5] = 0;
          local_168.data._M_elems._24_5_ = 0;
          local_168.data._M_elems[7]._1_3_ = 0;
          local_168.data._M_elems._32_5_ = 0;
          local_168.data._M_elems[9]._1_3_ = 0;
          local_168.exp = 0;
          local_168.neg = false;
          local_348.fpclass = cpp_dec_float_finite;
          local_348.prec_elem = 10;
          local_348.data._M_elems[0] = 0;
          local_348.data._M_elems[1] = 0;
          local_348.data._M_elems[2] = 0;
          local_348.data._M_elems[3] = 0;
          local_348.data._M_elems[4] = 0;
          local_348.data._M_elems[5] = 0;
          local_348.data._M_elems._24_5_ = 0;
          local_348.data._M_elems[7]._1_3_ = 0;
          local_348.data._M_elems._32_5_ = 0;
          local_348._37_8_ = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_348,0.001);
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_168,&local_348,&local_e0);
          *(ulong *)((local_310->m_backend).data._M_elems + 8) =
               CONCAT35(local_168.data._M_elems[9]._1_3_,local_168.data._M_elems._32_5_);
          *(undefined8 *)((local_310->m_backend).data._M_elems + 4) = local_168.data._M_elems._16_8_
          ;
          *(ulong *)((local_310->m_backend).data._M_elems + 6) =
               CONCAT35(local_168.data._M_elems[7]._1_3_,local_168.data._M_elems._24_5_);
          *(undefined8 *)(local_310->m_backend).data._M_elems = local_168.data._M_elems._0_8_;
          *(undefined8 *)((local_310->m_backend).data._M_elems + 2) = local_168.data._M_elems._8_8_;
          (this->_solver).entertolscale.m_backend.exp = local_168.exp;
          (this->_solver).entertolscale.m_backend.neg = local_168.neg;
          uVar14 = local_168._48_8_;
        }
        (this->_solver).entertolscale.m_backend.fpclass = (fpclass_type)uVar14;
        (this->_solver).entertolscale.m_backend.prec_elem = SUB84(uVar14,4);
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::leavetol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_e0,this_00);
        if (local_e0.fpclass == cpp_dec_float_NaN) {
LAB_00355e70:
          local_1f8._0_4_ = cpp_dec_float_finite;
          local_1f8._4_4_ = 10;
          local_228 = 0;
          uStack_220 = 0;
          local_218 = 0;
          uStack_210 = 0;
          uStack_20b = 0;
          local_208 = 0;
          uStack_203 = 0;
          local_200 = 0;
          local_1fc = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_228,1000.0);
          *(undefined8 *)(local_2e8->m_backend).data._M_elems = local_228;
          *(undefined8 *)((local_2e8->m_backend).data._M_elems + 2) = uStack_220;
          *(undefined8 *)((local_2e8->m_backend).data._M_elems + 4) = local_218;
          *(ulong *)((local_2e8->m_backend).data._M_elems + 6) = CONCAT35(uStack_20b,uStack_210);
          *(ulong *)((local_2e8->m_backend).data._M_elems + 8) = CONCAT35(uStack_203,local_208);
          (this->_solver).leavetolscale.m_backend.exp = local_200;
          (this->_solver).leavetolscale.m_backend.neg = local_1fc;
          uVar14 = local_1f8;
        }
        else {
          local_348.fpclass = cpp_dec_float_finite;
          local_348.prec_elem = 10;
          local_348.data._M_elems[0] = 0;
          local_348.data._M_elems[1] = 0;
          local_348.data._M_elems[2] = 0;
          local_348.data._M_elems[3] = 0;
          local_348.data._M_elems[4] = 0;
          local_348.data._M_elems[5] = 0;
          local_348.data._M_elems._24_5_ = 0;
          local_348.data._M_elems[7]._1_3_ = 0;
          local_348.data._M_elems._32_5_ = 0;
          local_348._37_8_ = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_348,1e-06);
          iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_e0,&local_348);
          if (iVar12 < 1) goto LAB_00355e70;
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::leavetol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_e0,this_00);
          local_1e8.fpclass = cpp_dec_float_finite;
          local_1e8.prec_elem = 10;
          local_1e8.data._M_elems[0] = 0;
          local_1e8.data._M_elems[1] = 0;
          local_1e8.data._M_elems[2] = 0;
          local_1e8.data._M_elems[3] = 0;
          local_1e8.data._M_elems[4] = 0;
          local_1e8.data._M_elems[5] = 0;
          local_1e8.data._M_elems._24_5_ = 0;
          local_1e8.data._M_elems[7]._1_3_ = 0;
          local_1e8.data._M_elems._32_5_ = 0;
          local_1e8.data._M_elems[9]._1_3_ = 0;
          local_1e8.exp = 0;
          local_1e8.neg = false;
          local_348.fpclass = cpp_dec_float_finite;
          local_348.prec_elem = 10;
          local_348.data._M_elems[0] = 0;
          local_348.data._M_elems[1] = 0;
          local_348.data._M_elems[2] = 0;
          local_348.data._M_elems[3] = 0;
          local_348.data._M_elems[4] = 0;
          local_348.data._M_elems[5] = 0;
          local_348.data._M_elems._24_5_ = 0;
          local_348.data._M_elems[7]._1_3_ = 0;
          local_348.data._M_elems._32_5_ = 0;
          local_348._37_8_ = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_348,0.001);
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_1e8,&local_348,&local_e0);
          *(ulong *)((local_2e8->m_backend).data._M_elems + 8) =
               CONCAT35(local_1e8.data._M_elems[9]._1_3_,local_1e8.data._M_elems._32_5_);
          *(undefined8 *)((local_2e8->m_backend).data._M_elems + 4) = local_1e8.data._M_elems._16_8_
          ;
          *(ulong *)((local_2e8->m_backend).data._M_elems + 6) =
               CONCAT35(local_1e8.data._M_elems[7]._1_3_,local_1e8.data._M_elems._24_5_);
          *(undefined8 *)(local_2e8->m_backend).data._M_elems = local_1e8.data._M_elems._0_8_;
          *(undefined8 *)((local_2e8->m_backend).data._M_elems + 2) = local_1e8.data._M_elems._8_8_;
          (this->_solver).leavetolscale.m_backend.exp = local_1e8.exp;
          (this->_solver).leavetolscale.m_backend.neg = local_1e8.neg;
          uVar14 = local_1e8._48_8_;
        }
        (this->_solver).leavetolscale.m_backend.fpclass = (fpclass_type)uVar14;
        (this->_solver).leavetolscale.m_backend.prec_elem = SUB84(uVar14,4);
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::entertol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_e0,this_00);
        if (local_e0.fpclass == cpp_dec_float_NaN) {
          bVar19 = false;
        }
        else {
          local_348.fpclass = cpp_dec_float_finite;
          local_348.prec_elem = 10;
          local_348.data._M_elems[0] = 0;
          local_348.data._M_elems[1] = 0;
          local_348.data._M_elems[2] = 0;
          local_348.data._M_elems[3] = 0;
          local_348.data._M_elems[4] = 0;
          local_348.data._M_elems[5] = 0;
          local_348.data._M_elems._24_5_ = 0;
          local_348.data._M_elems[7]._1_3_ = 0;
          local_348.data._M_elems._32_5_ = 0;
          local_348._37_8_ = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_348,0.001);
          iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_e0,&local_348);
          bVar19 = -1 < iVar12;
        }
      }
      bVar7 = true;
      bVar18 = false;
      bVar16 = true;
      bVar17 = false;
      goto LAB_00355353;
    }
    VVar3 = (this->spxout).m_verbosity;
    if (2 < (int)VVar3) {
      (this->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[3],"Switching simplification.",0x19);
      poVar4 = (this->spxout).m_streams[(this->spxout).m_verbosity];
      cVar6 = (char)poVar4;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
      (this->spxout).m_verbosity = VVar3;
    }
    if (value_01 == 0) {
      setIntParam(this,SIMPLIFIER,3,true);
    }
    else {
      bVar18 = false;
      bVar7 = true;
      bVar8 = true;
      bVar16 = true;
      bVar17 = true;
      fromscratch = true;
      if (0 < DAT_006abda8) goto LAB_00355353;
      bVar8 = true;
      bVar16 = true;
      bVar17 = true;
      fromscratch = true;
      if (DAT_006abe18 < 0) goto LAB_00355353;
      this->_boostedSimplifier =
           (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)0x0;
      this->_simplifier =
           (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)0x0;
      this->_currentSettings->_intParamValues[10] = 0;
    }
    bVar8 = true;
  }
  else {
    VVar3 = (this->spxout).m_verbosity;
    if (2 < (int)VVar3) {
      (this->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[3],"Switching scaling.",0x12);
      poVar4 = (this->spxout).m_streams[(this->spxout).m_verbosity];
      cVar6 = (char)poVar4;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
      (this->spxout).m_verbosity = VVar3;
    }
    if (value_02 == 0) {
      setIntParam(this,SCALER,2,true);
    }
    else {
      bVar18 = false;
      bVar7 = true;
      bVar16 = true;
      bVar17 = true;
      fromscratch = true;
      if (0 < DAT_006abdac) goto LAB_00355353;
      bVar16 = true;
      bVar17 = true;
      fromscratch = true;
      if (DAT_006abe1c < 0) goto LAB_00355353;
      this->_boostedScaler =
           (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)0x0;
      this->_scaler =
           (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)0x0;
      this->_currentSettings->_intParamValues[0xb] = 0;
    }
  }
  bVar7 = true;
  bVar16 = true;
  goto LAB_00355b0a;
LAB_00355664:
  VVar3 = (this->spxout).m_verbosity;
  if (2 < (int)VVar3) {
    (this->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[3],"Turning off preprocessing.",0x1a);
    poVar4 = (this->spxout).m_streams[(this->spxout).m_verbosity];
    cVar6 = (char)poVar4;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar6);
    std::ostream::put(cVar6);
    pSVar13 = (Settings *)std::ostream::flush();
    (this->spxout).m_verbosity = VVar3;
  }
  if ((DAT_006abdac < 1) && (-1 < DAT_006abe1c)) {
    this->_boostedScaler =
         (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0;
    this->_scaler =
         (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0;
    pSVar13 = this->_currentSettings;
    pSVar13->_intParamValues[0xb] = 0;
  }
  bVar18 = false;
  local_2d8 = CONCAT71((int7)((ulong)pSVar13 >> 8),1);
  bVar17 = true;
  fromscratch = true;
  if (0 < DAT_006abda8) goto LAB_00355353;
  bVar17 = true;
  fromscratch = true;
  if (DAT_006abe18 < 0) goto LAB_00355353;
  this->_boostedSimplifier =
       (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  this->_simplifier =
       (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  this->_currentSettings->_intParamValues[10] = 0;
LAB_00355b0a:
  bVar18 = false;
  bVar17 = true;
  fromscratch = true;
  goto LAB_00355353;
}

Assistant:

typename SPxSolverBase<R>::Status SoPlexBase<R>::_solveRealStable(bool acceptUnbounded,
      bool acceptInfeasible, VectorBase<R>& primal, VectorBase<R>& dual,
      DataArray< typename SPxSolverBase<R>::VarStatus >& basisStatusRows,
      DataArray< typename SPxSolverBase<R>::VarStatus >& basisStatusCols,
      const bool forceNoSimplifier)
{
   typename SPxSolverBase<R>::Status result = SPxSolverBase<R>::UNKNOWN;

   bool fromScratch = false;
   bool solved = false;
   bool solvedFromScratch = false;
   bool initialSolve = true;
   bool increasedMarkowitz = false;
   bool relaxedTolerances = false;
   bool tightenedTolerances = false;
   bool switchedScaler = false;
   bool switchedSimplifier = false;
   bool switchedRatiotester = false;
   bool switchedPricer = false;
   bool turnedoffPre = false;

   R markowitz = _slufactor.markowitz();
   int ratiotester = intParam(SoPlexBase<R>::RATIOTESTER);
   int pricer = intParam(SoPlexBase<R>::PRICER);
   int simplifier = intParam(SoPlexBase<R>::SIMPLIFIER);
   int scaler = intParam(SoPlexBase<R>::SCALER);
   int type = intParam(SoPlexBase<R>::ALGORITHM);

   if(forceNoSimplifier)
      setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

   while(true)
   {
      assert(!increasedMarkowitz || GE(_slufactor.markowitz(), R(0.9), this->tolerances()->epsilon()));

      result = _solveRealForRational(fromScratch, primal, dual, basisStatusRows, basisStatusCols);

      solved = (result == SPxSolverBase<R>::OPTIMAL)
               || (result == SPxSolverBase<R>::INFEASIBLE && acceptInfeasible)
               || (result == SPxSolverBase<R>::UNBOUNDED && acceptUnbounded);

      if(solved || result == SPxSolverBase<R>::ABORT_TIME || result == SPxSolverBase<R>::ABORT_ITER)
         break;

      if(initialSolve)
      {
         SPX_MSG_INFO1(spxout, spxout << "Numerical troubles during floating-point solve." << std::endl);
         initialSolve = false;
      }

      if(!turnedoffPre
            && (intParam(SoPlexBase<R>::SIMPLIFIER) != SoPlexBase<R>::SIMPLIFIER_OFF
                || intParam(SoPlexBase<R>::SCALER) != SoPlexBase<R>::SCALER_OFF))
      {
         SPX_MSG_INFO1(spxout, spxout << "Turning off preprocessing." << std::endl);

         turnedoffPre = true;

         setIntParam(SoPlexBase<R>::SCALER, SoPlexBase<R>::SCALER_OFF);
         setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

         fromScratch = true;
         solvedFromScratch = true;
         continue;
      }

      setIntParam(SoPlexBase<R>::SCALER, scaler);
      setIntParam(SoPlexBase<R>::SIMPLIFIER, simplifier);

      if(!increasedMarkowitz)
      {
         SPX_MSG_INFO1(spxout, spxout << "Increasing Markowitz threshold." << std::endl);

         _slufactor.setMarkowitz(0.9);
         increasedMarkowitz = true;

         try
         {
            _solver.factorize();
            continue;
         }
         catch(...)
         {
            SPxOut::debug(this, "Factorization failed.\n");
         }
      }

      if(!solvedFromScratch)
      {
         SPX_MSG_INFO1(spxout, spxout << "Solving from scratch." << std::endl);

         fromScratch = true;
         solvedFromScratch = true;
         continue;
      }

      setIntParam(SoPlexBase<R>::RATIOTESTER, ratiotester);
      setIntParam(SoPlexBase<R>::PRICER, pricer);

      if(!switchedScaler)
      {
         SPX_MSG_INFO1(spxout, spxout << "Switching scaling." << std::endl);

         if(scaler == int(SoPlexBase<R>::SCALER_OFF))
            setIntParam(SoPlexBase<R>::SCALER, SoPlexBase<R>::SCALER_BIEQUI);
         else
            setIntParam(SoPlexBase<R>::SCALER, SoPlexBase<R>::SCALER_OFF);

         fromScratch = true;
         solvedFromScratch = true;
         switchedScaler = true;
         continue;
      }

      if(!switchedSimplifier && !forceNoSimplifier)
      {
         SPX_MSG_INFO1(spxout, spxout << "Switching simplification." << std::endl);

         if(simplifier == int(SoPlexBase<R>::SIMPLIFIER_OFF))
            setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_INTERNAL);
         else
            setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

         fromScratch = true;
         solvedFromScratch = true;
         switchedSimplifier = true;
         continue;
      }

      setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

      if(!relaxedTolerances)
      {
         SPX_MSG_INFO1(spxout, spxout << "Relaxing tolerances." << std::endl);

         setIntParam(SoPlexBase<R>::ALGORITHM, SoPlexBase<R>::ALGORITHM_PRIMAL);

         // scale tols by up 1e3 but so that they do not exceed 1e-3
         if(_solver.entertol() > 1e-6)
            _solver.scaleEntertol(1e-3 / _solver.entertol());
         else
            _solver.scaleEntertol(1e3);

         if(_solver.leavetol() > 1e-6)
            _solver.scaleLeavetol(1e-3 / _solver.leavetol());
         else
            _solver.scaleLeavetol(1e3);

         relaxedTolerances = _solver.entertol() >= 1e-3;
         solvedFromScratch = false;
         continue;
      }

      if(!tightenedTolerances && result != SPxSolverBase<R>::INFEASIBLE)
      {
         SPX_MSG_INFO1(spxout, spxout << "Tightening tolerances." << std::endl);

         setIntParam(SoPlexBase<R>::ALGORITHM, SoPlexBase<R>::ALGORITHM_DUAL);

         // scale tols by up 1e-3 but so that they are not smaller than 1e-9
         if(_solver.entertol() < 1e-6)
            _solver.scaleEntertol(1e-9 / _solver.entertol());
         else
            _solver.scaleEntertol(1e-3);

         tightenedTolerances = _solver.entertol() <= 1e-9;
         solvedFromScratch = false;
         continue;
      }

      setIntParam(SoPlexBase<R>::ALGORITHM, type);

      if(!switchedRatiotester)
      {
         SPX_MSG_INFO1(spxout, spxout << "Switching ratio test." << std::endl);

         _solver.setType(_solver.type() == SPxSolverBase<R>::LEAVE ? SPxSolverBase<R>::ENTER :
                         SPxSolverBase<R>::LEAVE);

         if(_solver.ratiotester() != (SPxRatioTester<R>*)&_ratiotesterTextbook)
            setIntParam(SoPlexBase<R>::RATIOTESTER, RATIOTESTER_TEXTBOOK);
         else
            setIntParam(SoPlexBase<R>::RATIOTESTER, RATIOTESTER_FAST);

         switchedRatiotester = true;
         solvedFromScratch = false;
         continue;
      }

      if(!switchedPricer)
      {
         SPX_MSG_INFO1(spxout, spxout << "Switching pricer." << std::endl);

         _solver.setType(_solver.type() == SPxSolverBase<R>::LEAVE ? SPxSolverBase<R>::ENTER :
                         SPxSolverBase<R>::LEAVE);

         if(_solver.pricer() != (SPxPricer<R>*)&_pricerDevex)
            setIntParam(SoPlexBase<R>::PRICER, PRICER_DEVEX);
         else
            setIntParam(SoPlexBase<R>::PRICER, PRICER_STEEP);

         switchedPricer = true;
         solvedFromScratch = false;
         continue;
      }

      SPX_MSG_INFO1(spxout, spxout << "Giving up." << std::endl);

      break;
   }

   _slufactor.setMarkowitz(markowitz);

   setIntParam(SoPlexBase<R>::RATIOTESTER, ratiotester);
   setIntParam(SoPlexBase<R>::PRICER, pricer);
   setIntParam(SoPlexBase<R>::SIMPLIFIER, simplifier);
   setIntParam(SoPlexBase<R>::SCALER, scaler);
   setIntParam(SoPlexBase<R>::ALGORITHM, type);

   return result;
}